

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon_x11.cpp
# Opt level: O0

void __thiscall QSystemTrayIconPrivate::QSystemTrayIconPrivate(QSystemTrayIconPrivate *this)

{
  QPlatformTheme *pQVar1;
  undefined8 uVar2;
  QObjectPrivate *in_RDI;
  
  QObjectPrivate::QObjectPrivate(in_RDI,QObjectPrivateVersion);
  *(undefined ***)in_RDI = &PTR__QSystemTrayIconPrivate_00d375d0;
  QPointer<QMenu>::QPointer((QPointer<QMenu> *)0xa9aa4d);
  QIcon::QIcon((QIcon *)(in_RDI + 0x88));
  QString::QString((QString *)0xa9aa6f);
  *(undefined8 *)(in_RDI + 0xa8) = 0;
  pQVar1 = QGuiApplicationPrivate::platformTheme();
  uVar2 = (**(code **)(*(long *)pQVar1 + 0x40))();
  *(undefined8 *)(in_RDI + 0xb0) = uVar2;
  in_RDI[0xb8] = (QObjectPrivate)0x0;
  *(undefined8 *)(in_RDI + 0xc0) = 0;
  return;
}

Assistant:

QSystemTrayIconPrivate::QSystemTrayIconPrivate()
    : sys(nullptr),
      qpa_sys(QGuiApplicationPrivate::platformTheme()->createPlatformSystemTrayIcon()),
      visible(false),
      trayWatcher(nullptr)
{
}